

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezc3d.cpp
# Opt level: O2

size_t __thiscall ezc3d::c3d::channelIdx(c3d *this,string *channelName)

{
  int iVar1;
  invalid_argument *this_00;
  size_t i;
  ulong uVar2;
  long lVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  channelNames_abi_cxx11_(&local_78,this);
  lVar3 = 0;
  uVar2 = 0;
  while( true ) {
    if ((ulong)((long)local_78.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_78.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar2) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::operator+(&local_60,"ezc3d::channelIdx could not find ",channelName);
      std::operator+(&local_40,&local_60," in the analogous data set");
      std::invalid_argument::invalid_argument(this_00,(string *)&local_40);
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    iVar1 = std::__cxx11::string::compare
                      ((string *)
                       ((long)&((local_78.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar3));
    if (iVar1 == 0) break;
    uVar2 = uVar2 + 1;
    lVar3 = lVar3 + 0x20;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  return uVar2;
}

Assistant:

size_t ezc3d::c3d::channelIdx(const std::string &channelName) const {
  const std::vector<std::string> &currentNames(channelNames());
  for (size_t i = 0; i < currentNames.size(); ++i)
    if (!currentNames[i].compare(channelName))
      return i;
  throw std::invalid_argument("ezc3d::channelIdx could not find " +
                              channelName + " in the analogous data set");
}